

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,ErrorList *elst)

{
  ostream *poVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < (int)((ulong)(*(long *)(elst + 8) - *(long *)elst) >> 3);
      lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<(os,(string *)(*(long *)(*(long *)elst + lVar2 * 8) + 8));
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)(*(long *)(*(long *)elst + lVar2 * 8) + 0x28));
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = std::operator<<(poVar1,_ZN5amrexL8err_nameE_rel +
                                    *(int *)(_ZN5amrexL8err_nameE_rel +
                                            (ulong)*(uint *)(*(long *)(*(long *)elst + lVar2 * 8) +
                                                            0x2c) * 4));
    std::operator<<(poVar1,'\n');
  }
  return os;
}

Assistant:

std::ostream&
operator << (std::ostream&    os,
             const ErrorList& elst)
{
    for (int i = 0; i < elst.size(); i++)
    {
        os << elst[i].name()
           << ' '
           << elst[i].nGrow()
           << ' '
           << err_name[elst[i].errType()]
           << '\n';
    }
    return os;
}